

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O0

GLFWglproc getProcAddressGLX(char *procname)

{
  char *procname_local;
  
  if (_glfw.glx.GetProcAddress == (PFNGLXGETPROCADDRESSPROC)0x0) {
    if (_glfw.glx.GetProcAddressARB == (PFNGLXGETPROCADDRESSPROC)0x0) {
      procname_local = (char *)dlsym(_glfw.glx.handle,procname);
    }
    else {
      procname_local = (char *)(*_glfw.glx.GetProcAddressARB)((GLubyte *)procname);
    }
  }
  else {
    procname_local = (char *)(*_glfw.glx.GetProcAddress)((GLubyte *)procname);
  }
  return (GLFWglproc)procname_local;
}

Assistant:

static GLFWglproc getProcAddressGLX(const char* procname)
{
    if (_glfw.glx.GetProcAddress)
        return _glfw.glx.GetProcAddress((const GLubyte*) procname);
    else if (_glfw.glx.GetProcAddressARB)
        return _glfw.glx.GetProcAddressARB((const GLubyte*) procname);
    else
        return dlsym(_glfw.glx.handle, procname);
}